

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadMessage.cpp
# Opt level: O3

bool __thiscall ReadMessage::fillMe(ReadMessage *this,string *parameter)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_30;
  
  if (this->ParameterCount == 1) {
    if ((parameter->_M_string_length == 0) ||
       (pcVar5 = (parameter->_M_dataplus)._M_p, (int)*pcVar5 - 0x3aU < 0xfffffff6 || *pcVar5 == 0x30
       )) {
      pcVar5 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
      pcVar6 = "Invalid Message Number - Must be integer bigger than 0!";
LAB_00104843:
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar5,(ulong)pcVar6);
      return false;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol(pcVar5,&local_30,10);
    if (local_30 == pcVar5) {
      std::__throw_invalid_argument("stoi");
LAB_001048e2:
      uVar4 = std::__throw_out_of_range("stoi");
      if (*piVar2 == 0) {
        *piVar2 = iVar1;
      }
      _Unwind_Resume(uVar4);
    }
    if (((int)lVar3 != lVar3) || (*piVar2 == 0x22)) goto LAB_001048e2;
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    this->MessageNumber = (int)lVar3;
    this->ParameterCount = this->ParameterCount + 1;
    pcVar5 = (this->super_ServerOperation).EXECUTEPENDING;
    pcVar6 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    strlen(pcVar5);
  }
  else {
    if (this->ParameterCount != 0) goto LAB_001048be;
    if (7 < parameter->_M_string_length - 2) {
      pcVar5 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
      pcVar6 = "Invalid User - Max 8 Characters!";
      goto LAB_00104843;
    }
    std::__cxx11::string::_M_assign((string *)&this->User);
    std::__cxx11::string::pop_back();
    this->ParameterCount = this->ParameterCount + 1;
    pcVar6 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    pcVar5 = "Message-number:";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar6,(ulong)pcVar5);
LAB_001048be:
  return this->ParameterCount != 2;
}

Assistant:

bool ReadMessage::fillMe(string parameter) {
    //fill the needed parameter
    if(ParameterCount == 0){
        if(parameter.length() <= 9 && parameter.length() > 1){ //is the Username given 1-8 chars long?
            User = parameter;
            User.pop_back();
            ParameterCount ++;
            statusMessage = "Message-number:";
        }
        else{
            statusMessage = "Invalid User - Max 8 Characters!";
            return false;
        }
    }
    else if(ParameterCount == 1){
        if(!parameter.empty() && isdigit(parameter[0]) && parameter[0] != '0'){ //is the parameter even a number bigger than 0?
            MessageNumber = stoi(parameter);
            ParameterCount ++;
            statusMessage = EXECUTEPENDING;
        }
        else{
            statusMessage = "Invalid Message Number - Must be integer bigger than 0!";
            return false;
        }
    }

    //check if ready and return true if != 2 and false if all parameters were given
    return ParameterCount != 2;
}